

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
visitDefault<slang::ast::GenericClassDefSymbol>
          (ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *this,
          GenericClassDefSymbol *t)

{
  DeclaredType *this_00;
  Expression *this_01;
  _Iterator<false> __begin0;
  _Iterator<false> local_40;
  _Parent local_28;
  
  this_00 = Symbol::getDeclaredType(&t->super_Symbol);
  if (this_00 != (DeclaredType *)0x0) {
    this_01 = DeclaredType::getInitializer(this_00);
    if (this_01 != (Expression *)0x0) {
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                (this_01,this_01,(CheckerMemberVisitor *)this);
    }
  }
  local_28._M_base._M_r = &t->specMap;
  local_40._M_current =
       boost::unordered::detail::foa::
       table<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
       ::begin(&(local_28._M_base._M_r)->table_);
  if (local_40._M_current.p_ != (table_element_pointer)0x0) {
    local_40._M_parent = &local_28;
    do {
      Symbol::visit<slang::ast::CheckerMemberVisitor&>
                (&(local_40._M_current.p_)->second->super_Symbol,(CheckerMemberVisitor *)this);
      std::ranges::
      transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/symbols/ClassSymbols.h:223:47)>
      ::_Iterator<false>::operator++(&local_40);
    } while (local_40._M_current.p_ != (table_element_pointer)0x0);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }